

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBridge.c
# Opt level: O1

DdNode * Cudd_addBddStrictThreshold(DdManager *dd,DdNode *f,double value)

{
  int *piVar1;
  DdNode *val;
  DdNode *pDVar2;
  
  val = cuddUniqueConst(dd,value);
  if (val != (DdNode *)0x0) {
    piVar1 = (int *)(((ulong)val & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    do {
      dd->reordered = 0;
      pDVar2 = addBddDoStrictThreshold(dd,f,val);
    } while (dd->reordered == 1);
    if (pDVar2 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      Cudd_RecursiveDeref(dd,val);
      piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + -1;
      return pDVar2;
    }
    Cudd_RecursiveDeref(dd,val);
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode *
Cudd_addBddStrictThreshold(
  DdManager * dd,
  DdNode * f,
  CUDD_VALUE_TYPE  value)
{
    DdNode *res;
    DdNode *val;
    
    val = cuddUniqueConst(dd,value);
    if (val == NULL) return(NULL);
    cuddRef(val);

    do {
        dd->reordered = 0;
        res = addBddDoStrictThreshold(dd, f, val);
    } while (dd->reordered == 1);

    if (res == NULL) {
        Cudd_RecursiveDeref(dd, val);
        return(NULL);
    }
    cuddRef(res);
    Cudd_RecursiveDeref(dd, val);
    cuddDeref(res);
    return(res);

}